

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O2

int GetTemperatureP33x(P33X *pP33x,double *pTemperature)

{
  uint in_EAX;
  int iVar1;
  ulong uStack_18;
  float fValue;
  
  uStack_18 = (ulong)in_EAX;
  iVar1 = ReadChannelP33x(pP33x,'\x04',&fValue);
  if (iVar1 == 0) {
    *pTemperature = (double)fValue;
    pP33x->LastTemperature = (double)fValue;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

inline int GetTemperatureP33x(P33X* pP33x, double* pTemperature)
{
	float fValue = 0;

	if (ReadChannelP33x(pP33x, TEMPERATURE_CHANNEL_P33X, &fValue) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	*pTemperature = (double)fValue;

	pP33x->LastTemperature = *pTemperature;

	return EXIT_SUCCESS;
}